

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall
YAJLFrameHeader::YAJLFrameHeader(YAJLFrameHeader *this,u16 marker,bitio_stream *bstream)

{
  pointer *ppYVar1;
  iterator __position;
  undefined8 in_RAX;
  ssize_t sVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar4;
  YAJLFrameHeaderSpec spec;
  undefined8 uStack_38;
  
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = in_RAX;
  sVar2 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  this->sof = marker;
  sVar3 = bitio::bitio_stream::read(bstream,8,__buf,in_RCX);
  this->precision = (u8)sVar3;
  sVar3 = bitio::bitio_stream::read(bstream,0x10,__buf_00,in_RCX);
  this->nlines = (u16)sVar3;
  sVar3 = bitio::bitio_stream::read(bstream,0x10,__buf_01,in_RCX);
  this->nsamples_per_line = (u16)sVar3;
  sVar3 = bitio::bitio_stream::read(bstream,8,__buf_02,in_RCX);
  this->ncomponents = (u8)sVar3;
  uVar4 = (int)sVar2 + 0xfff8U & 0xffff;
  if (uVar4 != 0) {
    do {
      YAJLFrameHeaderSpec::YAJLFrameHeaderSpec
                ((YAJLFrameHeaderSpec *)((long)&uStack_38 + 4),bstream);
      __position._M_current =
           (this->specs).
           super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->specs).
          super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<YAJLFrameHeaderSpec,std::allocator<YAJLFrameHeaderSpec>>::
        _M_realloc_insert<YAJLFrameHeaderSpec_const&>
                  ((vector<YAJLFrameHeaderSpec,std::allocator<YAJLFrameHeaderSpec>> *)&this->specs,
                   __position,(YAJLFrameHeaderSpec *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uStack_38._4_4_;
        ppYVar1 = &(this->specs).
                   super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppYVar1 = *ppYVar1 + 1;
      }
      uVar4 = uVar4 + 0xfffd & 0xffff;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

YAJLFrameHeader::YAJLFrameHeader(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    // remove non-recurring lengths.
    length -= 8;

    sof = marker;
    precision = bstream->read(0x8);
    nlines = bstream->read(0x10);
    nsamples_per_line = bstream->read(0x10);
    ncomponents = bstream->read(0x8);

    while (length > 0) {
        YAJLFrameHeaderSpec spec(bstream);
        specs.push_back(spec);
        length -= 3;
    }
}